

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall Js::ByteCodeWriter::RecordFrameDisplayRegister(ByteCodeWriter *this,RegSlot slot)

{
  RegSlot slot_00;
  RegSlot slot_local;
  ByteCodeWriter *this_local;
  
  slot_00 = ConsumeReg(this,slot);
  FunctionBody::RecordFrameDisplayRegister(this->m_functionWrite,slot_00);
  return;
}

Assistant:

void ByteCodeWriter::RecordFrameDisplayRegister(RegSlot slot)
    {
        slot = ConsumeReg(slot);
        m_functionWrite->RecordFrameDisplayRegister(slot);
    }